

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

void __thiscall cmTargetTraceDependencies::FollowName(cmTargetTraceDependencies *this,string *name)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  vector<cmSourceFile*,std::allocator<cmSourceFile*>> *this_00;
  iterator __position;
  iterator iVar3;
  cmSourceFile *pcVar4;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>_>,_bool>
  pVar5;
  value_type entry;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>
  local_50;
  
  iVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>_>_>
          ::find(&(this->NameMap)._M_t,name);
  if ((_Rb_tree_header *)iVar3._M_node == &(this->NameMap)._M_t._M_impl.super__Rb_tree_header) {
    pcVar4 = cmMakefile::GetSourceFileWithOutput(this->Makefile,name);
    paVar1 = &local_50.first.field_2;
    pcVar2 = (name->_M_dataplus)._M_p;
    local_50.first._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar2,pcVar2 + name->_M_string_length);
    local_50.second = pcVar4;
    pVar5 = std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmSourceFile*>,std::_Select1st<std::pair<std::__cxx11::string_const,cmSourceFile*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmSourceFile*>>>
            ::_M_emplace_unique<std::pair<std::__cxx11::string_const,cmSourceFile*>&>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmSourceFile*>,std::_Select1st<std::pair<std::__cxx11::string_const,cmSourceFile*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmSourceFile*>>>
                        *)&this->NameMap,&local_50);
    iVar3._M_node = (_Base_ptr)pVar5.first._M_node;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50.first._M_dataplus._M_p != paVar1) {
      operator_delete(local_50.first._M_dataplus._M_p,
                      local_50.first.field_2._M_allocated_capacity + 1);
    }
  }
  local_50.first._M_dataplus._M_p = *(pointer *)(iVar3._M_node + 2);
  if ((cmSourceFile *)local_50.first._M_dataplus._M_p != (cmSourceFile *)0x0) {
    this_00 = (vector<cmSourceFile*,std::allocator<cmSourceFile*>> *)this->CurrentEntry;
    if (this_00 != (vector<cmSourceFile*,std::allocator<cmSourceFile*>> *)0x0) {
      __position._M_current = *(cmSourceFile ***)(this_00 + 8);
      if (__position._M_current == *(cmSourceFile ***)(this_00 + 0x10)) {
        std::vector<cmSourceFile*,std::allocator<cmSourceFile*>>::
        _M_realloc_insert<cmSourceFile*const&>(this_00,__position,(cmSourceFile **)&local_50);
      }
      else {
        *__position._M_current = (cmSourceFile *)local_50.first._M_dataplus._M_p;
        *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
      }
    }
    QueueSource(this,(cmSourceFile *)local_50.first._M_dataplus._M_p);
  }
  return;
}

Assistant:

void cmTargetTraceDependencies::FollowName(std::string const& name)
{
  NameMapType::iterator i = this->NameMap.find(name);
  if (i == this->NameMap.end()) {
    // Check if we know how to generate this file.
    cmSourceFile* sf = this->Makefile->GetSourceFileWithOutput(name);
    NameMapType::value_type entry(name, sf);
    i = this->NameMap.insert(entry).first;
  }
  if (cmSourceFile* sf = i->second) {
    // Record the dependency we just followed.
    if (this->CurrentEntry) {
      this->CurrentEntry->Depends.push_back(sf);
    }
    this->QueueSource(sf);
  }
}